

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4ffb8::BinaryExpr::BinaryExpr(BinaryExpr *this,ExprPtr *l,ExprPtr *r)

{
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__BinaryExpr_00166018;
  std::__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2> *)&this->left,
             (__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2> *)l);
  std::__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2> *)&this->right,
             (__shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2> *)r);
  return;
}

Assistant:

BinaryExpr(const ExprPtr &l, const ExprPtr &r) :
		left(l), right(r) { }